

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

shared_ptr<Face> __thiscall Face::get_sending_neighbor(Face *this,Corner corner,Direction dir)

{
  code *pcVar1;
  int in_ECX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  long lVar3;
  shared_ptr<Face> sVar4;
  Direction dir_local;
  Corner corner_local;
  Face *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,corner);
  switch(dir) {
  case clockwise:
    if (in_ECX == 0) {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x108));
      _Var2._M_pi = extraout_RDX;
    }
    else {
      std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0xf8))
      ;
      _Var2._M_pi = extraout_RDX_00;
    }
    break;
  case counterclockwise:
    if (in_ECX == 0) {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x128));
      _Var2._M_pi = extraout_RDX_01;
    }
    else {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x118));
      _Var2._M_pi = extraout_RDX_02;
    }
    break;
  case 2:
    if (in_ECX == 0) {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x148));
      _Var2._M_pi = extraout_RDX_03;
    }
    else {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x138));
      _Var2._M_pi = extraout_RDX_04;
    }
    break;
  case 3:
    if (in_ECX == 0) {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x168));
      _Var2._M_pi = extraout_RDX_05;
    }
    else {
      std::shared_ptr<Face>::shared_ptr
                ((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar3 + 0x158));
      _Var2._M_pi = extraout_RDX_06;
    }
    break;
  default:
    printf("Invalid move specified");
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Face>)sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Face> Face::get_sending_neighbor(Corner corner, Direction dir){
    switch (corner)
    {
    case Corner::U:
        if(dir == Direction::clockwise){
            return neighbors.U_neighbor_right;
        }
        else{
            return neighbors.U_neighbor_left;
        }
        break;
    case Corner::L:
        if(dir == Direction::clockwise){
            return neighbors.L_neighbor_right;
        }
        else{
            return neighbors.L_neighbor_left;
        }
        break;
    case Corner::R:
        if(dir == Direction::clockwise){
            return neighbors.R_neighbor_right;
        }
        else{
            return neighbors.R_neighbor_left;
        }
        break;
    case Corner::B:
        if(dir == Direction::clockwise){
            return neighbors.B_neighbor_right;
        }
        else{
            return neighbors.B_neighbor_left;
        }
        break;
    default:
        printf("Invalid move specified");
        break;
    }
}